

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O1

void __thiscall sf::VertexBuffer::VertexBuffer(VertexBuffer *this,PrimitiveType type,Usage usage)

{
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Drawable_00293588;
  GlResource::GlResource((GlResource *)this);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__VertexBuffer_00293890;
  this->m_buffer = 0;
  this->m_size = 0;
  this->m_primitiveType = type;
  this->m_usage = usage;
  return;
}

Assistant:

VertexBuffer::VertexBuffer(PrimitiveType type, VertexBuffer::Usage usage) :
m_buffer       (0),
m_size         (0),
m_primitiveType(type),
m_usage        (usage)
{
}